

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutNode.c
# Opt level: O2

void Cut_NodeDoComputeCuts
               (Cut_Man_t *p,Cut_List_t *pSuper,int Node,int fCompl0,int fCompl1,Cut_Cut_t *pList0,
               Cut_Cut_t *pList1,int fTriv,int TreeCode)

{
  long lVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  Cut_Cut_t *pCVar5;
  ulong uVar6;
  Cut_Cut_t *pCVar7;
  Cut_Cut_t *pCVar8;
  Cut_Cut_t *pCVar9;
  ulong uVar10;
  Cut_Cut_t *pCVar11;
  Cut_Cut_t *pCut0;
  Cut_Cut_t *local_48;
  
  if (fTriv != 0) {
    pCVar5 = Cut_CutCreateTriv(p,Node);
    Cut_ListAdd(pSuper,pCVar5);
    p->nNodeCuts = p->nNodeCuts + 1;
  }
  if ((pList1 != (Cut_Cut_t *)0x0 && pList0 != (Cut_Cut_t *)0x0) &&
     ((TreeCode == 0 || (p->pParams->fLocal == 0)))) {
    uVar3 = p->pParams->nVarsMax;
    p->fSimul = (*(uint *)pList1 >> 0x16 & 1 ^ fCompl1) & (*(uint *)pList0 >> 0x16 & 1 ^ fCompl0);
    p->fCompl0 = fCompl0;
    p->fCompl1 = fCompl1;
    if ((TreeCode & 1U) == 0) {
      pCVar5 = (Cut_Cut_t *)0x0;
    }
    else {
      if (((undefined1  [24])*pList0 & (undefined1  [24])0xf0000000) != (undefined1  [24])0x10000000
         ) {
        __assert_fail("pList0->nLeaves == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/cut/cutNode.c"
                      ,600,
                      "void Cut_NodeDoComputeCuts(Cut_Man_t *, Cut_List_t *, int, int, int, Cut_Cut_t *, Cut_Cut_t *, int, int)"
                     );
      }
      pCVar5 = pList0->pNext;
      pList0->pNext = (Cut_Cut_t *)0x0;
    }
    pCVar11 = pList0;
    if ((TreeCode & 2U) == 0) {
      local_48 = (Cut_Cut_t *)0x0;
    }
    else {
      if (((undefined1  [24])*pList1 & (undefined1  [24])0xf0000000) != (undefined1  [24])0x10000000
         ) {
        __assert_fail("pList1->nLeaves == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/cut/cutNode.c"
                      ,0x25e,
                      "void Cut_NodeDoComputeCuts(Cut_Man_t *, Cut_List_t *, int, int, int, Cut_Cut_t *, Cut_Cut_t *, int, int)"
                     );
      }
      local_48 = pList1->pNext;
      pList1->pNext = (Cut_Cut_t *)0x0;
    }
    for (; (pCVar7 = pList1, pCVar11 != (Cut_Cut_t *)0x0 && (*(uint *)pCVar11 >> 0x1c != uVar3));
        pCVar11 = pCVar11->pNext) {
    }
    for (; (pCVar9 = pList0, pCVar7 != (Cut_Cut_t *)0x0 && (*(uint *)pCVar7 >> 0x1c != uVar3));
        pCVar7 = pCVar7->pNext) {
    }
    for (; pCVar8 = pList1, pCut0 = pList0, pCVar9 != pCVar11; pCVar9 = pCVar9->pNext) {
      for (; pCVar8 != pCVar7; pCVar8 = pCVar8->pNext) {
        iVar4 = Cut_CutProcessTwo(p,pCVar9,pCVar8,pSuper);
        if (iVar4 != 0) goto LAB_003f493e;
      }
    }
    for (; pCVar9 = pCVar7, pCut0 != pCVar11; pCut0 = pCut0->pNext) {
      for (; pCVar9 != (Cut_Cut_t *)0x0; pCVar9 = pCVar9->pNext) {
        if (((pCut0->uSign & ~pCVar9->uSign) == 0) &&
           (iVar4 = Cut_CutProcessTwo(p,pCut0,pCVar9,pSuper), iVar4 != 0)) goto LAB_003f493e;
      }
    }
    for (; pCVar9 = pCVar11, pCVar8 != pCVar7; pCVar8 = pCVar8->pNext) {
      for (; pCVar9 != (Cut_Cut_t *)0x0; pCVar9 = pCVar9->pNext) {
        if (((pCVar8->uSign & ~pCVar9->uSign) == 0) &&
           (iVar4 = Cut_CutProcessTwo(p,pCVar9,pCVar8,pSuper), iVar4 != 0)) goto LAB_003f493e;
      }
    }
    uVar10 = 0;
    if (0 < (int)uVar3) {
      uVar10 = (ulong)uVar3;
    }
    for (; pCVar9 = pCVar7, pCVar11 != (Cut_Cut_t *)0x0; pCVar11 = pCVar11->pNext) {
      for (; pCVar9 != (Cut_Cut_t *)0x0; pCVar9 = pCVar9->pNext) {
        if ((*(uint *)pCVar11 >> 0x1c != uVar3) || (*(uint *)pCVar9 >> 0x1c != uVar3)) {
          __assert_fail("pTemp0->nLeaves == (unsigned)Limit && pTemp1->nLeaves == (unsigned)Limit",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/cut/cutNode.c"
                        ,0x287,
                        "void Cut_NodeDoComputeCuts(Cut_Man_t *, Cut_List_t *, int, int, int, Cut_Cut_t *, Cut_Cut_t *, int, int)"
                       );
        }
        if (pCVar11->uSign == pCVar9->uSign) {
          uVar6 = 0;
          do {
            if (uVar10 == uVar6) {
              iVar4 = Cut_CutProcessTwo(p,pCVar11,pCVar9,pSuper);
              if (iVar4 != 0) goto LAB_003f493e;
              break;
            }
            lVar1 = uVar6 * 4;
            lVar2 = uVar6 * 4;
            uVar6 = uVar6 + 1;
          } while (*(int *)(&pCVar11[1].field_0x0 + lVar1) == *(int *)(&pCVar9[1].field_0x0 + lVar2)
                  );
        }
      }
    }
    if (p->nNodeCuts == 0) {
      p->nNodesNoCuts = p->nNodesNoCuts + 1;
    }
LAB_003f493e:
    if ((TreeCode & 1U) != 0) {
      pList0->pNext = pCVar5;
    }
    if ((TreeCode & 2U) != 0) {
      pList1->pNext = local_48;
    }
  }
  return;
}

Assistant:

void Cut_NodeDoComputeCuts( Cut_Man_t * p, Cut_List_t * pSuper, int Node, int fCompl0, int fCompl1, Cut_Cut_t * pList0, Cut_Cut_t * pList1, int fTriv, int TreeCode )
{
    Cut_Cut_t * pStop0, * pStop1, * pTemp0, * pTemp1;
    Cut_Cut_t * pStore0 = NULL, * pStore1 = NULL; // Suppress "might be used uninitialized"
    int i, nCutsOld, Limit;
    // start with the elementary cut
    if ( fTriv ) 
    {
//        printf( "Creating trivial cut %d.\n", Node );
        pTemp0 = Cut_CutCreateTriv( p, Node );
        Cut_ListAdd( pSuper, pTemp0 );
        p->nNodeCuts++;
    }
    // get the cut lists of children
    if ( pList0 == NULL || pList1 == NULL || (p->pParams->fLocal && TreeCode)  )
        return;

    // remember the old number of cuts
    nCutsOld = p->nCutsCur;
    Limit = p->pParams->nVarsMax;
    // get the simultation bit of the node
    p->fSimul = (fCompl0 ^ pList0->fSimul) & (fCompl1 ^ pList1->fSimul);
    // set temporary variables
    p->fCompl0 = fCompl0;
    p->fCompl1 = fCompl1;
    // if tree cuts are computed, make sure only the unit cuts propagate over the DAG nodes
    if ( TreeCode & 1 )
    {
        assert( pList0->nLeaves == 1 );
        pStore0 = pList0->pNext;
        pList0->pNext = NULL;
    }
    if ( TreeCode & 2 )
    {
        assert( pList1->nLeaves == 1 );
        pStore1 = pList1->pNext;
        pList1->pNext = NULL;
    }
    // find the point in the list where the max-var cuts begin
    Cut_ListForEachCut( pList0, pStop0 )
        if ( pStop0->nLeaves == (unsigned)Limit )
            break;
    Cut_ListForEachCut( pList1, pStop1 )
        if ( pStop1->nLeaves == (unsigned)Limit )
            break;

    // small by small
    Cut_ListForEachCutStop( pList0, pTemp0, pStop0 )
    Cut_ListForEachCutStop( pList1, pTemp1, pStop1 )
    {
        if ( Cut_CutProcessTwo( p, pTemp0, pTemp1, pSuper ) )
            goto Quits;
    }
    // small by large
    Cut_ListForEachCutStop( pList0, pTemp0, pStop0 )
    Cut_ListForEachCut( pStop1, pTemp1 )
    {
        if ( (pTemp0->uSign & pTemp1->uSign) != pTemp0->uSign )
            continue;
        if ( Cut_CutProcessTwo( p, pTemp0, pTemp1, pSuper ) )
            goto Quits;
    }
    // small by large
    Cut_ListForEachCutStop( pList1, pTemp1, pStop1 )
    Cut_ListForEachCut( pStop0, pTemp0 )
    {
        if ( (pTemp0->uSign & pTemp1->uSign) != pTemp1->uSign )
            continue;
        if ( Cut_CutProcessTwo( p, pTemp0, pTemp1, pSuper ) )
            goto Quits;
    }
    // large by large
    Cut_ListForEachCut( pStop0, pTemp0 )
    Cut_ListForEachCut( pStop1, pTemp1 )
    {
        assert( pTemp0->nLeaves == (unsigned)Limit && pTemp1->nLeaves == (unsigned)Limit );
        if ( pTemp0->uSign != pTemp1->uSign )
            continue;
        for ( i = 0; i < Limit; i++ )
            if ( pTemp0->pLeaves[i] != pTemp1->pLeaves[i] )
                break;
        if ( i < Limit )
            continue;
        if ( Cut_CutProcessTwo( p, pTemp0, pTemp1, pSuper ) )
            goto Quits;
    } 
    if ( p->nNodeCuts == 0 )
        p->nNodesNoCuts++;
Quits:
    if ( TreeCode & 1 )
        pList0->pNext = pStore0;
    if ( TreeCode & 2 )
        pList1->pNext = pStore1;
}